

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testDistances(void)

{
  double dVar1;
  double dVar2;
  double distance;
  int i;
  int nrTests;
  
  dVar1 = maxErrorInMeters(99);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    foundError();
    maxErrorInMeters(99);
    printf("*** ERROR *** maxErrorInMeters(99) = %f (expected 0.0)\n");
  }
  dVar1 = distanceInMeters(0.0,0.0,0.0,1.5);
  testDistance(166979.23618950002,dVar1);
  dVar1 = distanceInMeters(0.0,0.0,0.0,2.0);
  testDistance(222638.981586,dVar1);
  dVar1 = distanceInMeters(0.0,0.0,0.0,2.5);
  testDistance(278298.7269825,dVar1);
  dVar1 = distanceInMeters(0.0,-1.0,0.0,0.5);
  testDistance(166979.23618950002,dVar1);
  dVar1 = distanceInMeters(0.0,-1.0,0.0,1.0);
  testDistance(222638.981586,dVar1);
  dVar1 = distanceInMeters(0.0,-1.0,0.0,1.5);
  testDistance(278298.7269825,dVar1);
  dVar1 = distanceInMeters(0.0,0.5,0.0,-1.0);
  testDistance(166979.23618950002,dVar1);
  dVar1 = distanceInMeters(0.0,1.0,0.0,-1.0);
  testDistance(222638.981586,dVar1);
  dVar1 = distanceInMeters(0.0,1.5,0.0,-1.0);
  testDistance(278298.7269825,dVar1);
  dVar1 = distanceInMeters(0.0,359.0,0.0,0.5);
  testDistance(166979.23618950002,dVar1);
  dVar1 = distanceInMeters(0.0,359.0,0.0,1.0);
  testDistance(222638.981586,dVar1);
  dVar1 = distanceInMeters(0.0,359.0,0.0,1.5);
  testDistance(278298.7269825,dVar1);
  dVar1 = distanceInMeters(0.0,0.5,0.0,359.0);
  testDistance(166979.23618950002,dVar1);
  dVar1 = distanceInMeters(0.0,1.0,0.0,359.0);
  testDistance(222638.981586,dVar1);
  dVar1 = distanceInMeters(0.0,1.5,0.0,359.0);
  testDistance(278298.7269825,dVar1);
  dVar1 = distanceInMeters(0.5,0.0,-0.5,0.0);
  testDistance(110946.252133,dVar1);
  dVar1 = distanceInMeters(1.0,0.0,-0.0,0.0);
  testDistance(110946.252133,dVar1);
  distance._4_4_ = 0x13;
  dVar1 = distanceInMeters(0.0,0.0,-1.0,0.0);
  testDistance(110946.252133,dVar1);
  for (distance._0_4_ = 0; (int)distance._0_4_ < 0x4b; distance._0_4_ = distance._0_4_ + 5) {
    dVar1 = distanceInMeters(testDistances::coordpairs[(int)distance._0_4_],
                             testDistances::coordpairs[(int)(distance._0_4_ + 1)],
                             testDistances::coordpairs[(int)(distance._0_4_ + 2)],
                             testDistances::coordpairs[(int)(distance._0_4_ + 3)]);
    distance._4_4_ = distance._4_4_ + 1;
    dVar2 = floor(dVar1 * 100000.0 + 0.5);
    if ((dVar2 != testDistances::coordpairs[(int)(distance._0_4_ + 4)]) ||
       (NAN(dVar2) || NAN(testDistances::coordpairs[(int)(distance._0_4_ + 4)]))) {
      foundError();
      printf("*** ERROR *** distanceInMeters %d failed: %f\n",dVar1,(ulong)distance._0_4_);
    }
  }
  return distance._4_4_;
}

Assistant:

static int testDistances(void) {
    static const double METERS_PER_DEGREE_LAT = 110946.252133;
    static const double METERS_PER_DEGREE_LON = 111319.490793;
    int nrTests = 0;
    int i;
    static const double coordpairs[] = {
            // lat1, lon1, lat2, lon2, expected distance * 100000
            1, 1, 1, 1, 0,
            0, 0, 0, 1, 11131949079,
            89, 0, 89, 1, 194279300,
            3, 0, 3, 1, 11116693130,
            -3, 0, -3, 1, 11116693130,
            -3, -179.5, -3, 179.5, 11116693130,
            -3, 179.5, -3, -179.5, 11116693130,
            3, 8, 3, 9, 11116693130,
            3, -8, 3, -9, 11116693130,
            3, -0.5, 3, 0.5, 11116693130,
            54, 5, 54.000001, 5, 11095,
            54, 5, 54, 5.000001, 6543,
            54, 5, 54.000001, 5.000001, 12880,
            90, 0, 90, 50, 0,
            0.11, 0.22, 0.12, 0.2333, 185011466
    };

    // check bad values    
    ++nrTests;
    if (maxErrorInMeters(99) != 0.0) {
        foundError();
        printf("*** ERROR *** maxErrorInMeters(99) = %f (expected 0.0)\n", maxErrorInMeters(99));
    }
    // check expected values    
    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 1.5, distanceInMeters(0.0, 0.0, 0.0, 1.5));  // Check if #define is correct.
    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 2.0, distanceInMeters(0.0, 0.0, 0.0, 2.0));
    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 2.5, distanceInMeters(0.0, 0.0, 0.0, 2.5));

    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 1.5, distanceInMeters(0.0, -1.0, 0.0, 0.5)); // Check around 0.
    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 2.0, distanceInMeters(0.0, -1.0, 0.0, 1.0));
    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 2.5, distanceInMeters(0.0, -1.0, 0.0, 1.5));

    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 1.5, distanceInMeters(0.0, 0.5, 0.0, -1.0));
    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 2.0, distanceInMeters(0.0, 1.0, 0.0, -1.0));
    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 2.5, distanceInMeters(0.0, 1.5, 0.0, -1.0));

    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 1.5, distanceInMeters(0.0, 359.0, 0.0, 0.5)); // Check around 360.
    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 2.0, distanceInMeters(0.0, 359.0, 0.0, 1.0));
    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 2.5, distanceInMeters(0.0, 359.0, 0.0, 1.5));

    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 1.5, distanceInMeters(0.0, 0.5, 0.0, 359.0)); // Note that shortest.
    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 2.0, distanceInMeters(0.0, 1.0, 0.0, 359.0)); // path needs to be taken!
    ++nrTests;
    testDistance(METERS_PER_DEGREE_LON * 2.5, distanceInMeters(0.0, 1.5, 0.0, 359.0));

    ++nrTests;
    testDistance(METERS_PER_DEGREE_LAT, distanceInMeters(0.5, 0.0, -0.5, 0.0)); // Check constant.
    ++nrTests;
    testDistance(METERS_PER_DEGREE_LAT, distanceInMeters(1.0, 0.0, -0.0, 0.0)); // Check around 0.
    ++nrTests;
    testDistance(METERS_PER_DEGREE_LAT, distanceInMeters(0.0, 0.0, -1.0, 0.0));

    for (i = 0; i < (int) (sizeof(coordpairs) / sizeof(coordpairs[0])); i += 5) {
        const double distance = distanceInMeters(
                coordpairs[i], coordpairs[i + 1],
                coordpairs[i + 2], coordpairs[i + 3]);
        ++nrTests;
        if (floor(0.5 + (100000.0 * distance)) != coordpairs[i + 4]) {
            foundError();
            printf("*** ERROR *** distanceInMeters %d failed: %f\n", i, distance);
        }
    }
    return nrTests;
}